

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall
prevector_tests::prevector_tester<8U,_int>::resize_uninitialized
          (prevector_tester<8U,_int> *this,realtype *values)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type *psVar6;
  prevector<8U,_int,_unsigned_int,_int> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  int v_1;
  realtype *__range2_1;
  size_type p;
  realtype *__range2;
  size_t s;
  size_t r;
  iterator __end0_1;
  iterator __begin0_1;
  int v;
  iterator __end0;
  iterator __begin0;
  prevector_tester<8U,_int> *in_stack_000000b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff74;
  prevector<8U,_int,_unsigned_int,_int> *__new_size;
  size_type new_size;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __new_size = in_RSI;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_stack_ffffffffffffff68);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_stack_ffffffffffffff68);
  sVar5 = std::vector<int,_std::allocator<int>_>::capacity(in_stack_ffffffffffffff68);
  if (sVar5 < (sVar4 >> 1) + sVar3) {
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_ffffffffffffffa8,
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  std::vector<int,_std::allocator<int>_>::resize(in_RDI,(size_type)__new_size);
  prevector<8U,_int,_unsigned_int,_int>::resize_uninitialized
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (size_type)((ulong)in_RDI >> 0x20));
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RSI,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    new_size = (size_type)((ulong)in_RDI >> 0x20);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff68);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RSI,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
              );
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff68);
  }
  prevector<8U,_int,_unsigned_int,_int>::size(in_RSI);
  prevector<8U,_int,_unsigned_int,_int>::resize_uninitialized
            ((prevector<8U,_int,_unsigned_int,_int> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),new_size);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  while( true ) {
    bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RSI,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    psVar6 = (size_type *)
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff74 = *psVar6;
    psVar6 = (size_type *)
             prevector<8U,_int,_unsigned_int,_int>::operator[](in_RSI,in_stack_ffffffffffffff74);
    *psVar6 = in_stack_ffffffffffffff74;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff68);
  }
  test(in_stack_000000b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_uninitialized(realtype values) {
        size_t r = values.size();
        size_t s = real_vector.size() / 2;
        if (real_vector.capacity() < s + r) {
            real_vector.reserve(s + r);
        }
        real_vector.resize(s);
        pre_vector.resize_uninitialized(s);
        for (auto v : values) {
            real_vector.push_back(v);
        }
        auto p = pre_vector.size();
        pre_vector.resize_uninitialized(p + r);
        for (auto v : values) {
            pre_vector[p] = v;
            ++p;
        }
        test();
    }